

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O0

_Bool proc_terminated(pid_t pid,int *exit_status)

{
  __pid_t _Var1;
  int iVar2;
  uint local_1c;
  int w;
  int wstatus;
  int *exit_status_local;
  pid_t pid_local;
  
  local_1c = 0;
  _w = exit_status;
  exit_status_local._0_4_ = pid;
  _Var1 = waitpid(pid,(int *)&local_1c,1);
  if (_Var1 < 0) {
    perror("waitpid");
    exit(1);
  }
  if (_Var1 == (pid_t)exit_status_local) {
    if (((local_1c & 0x7f) == 0) || ('\0' < (char)(((byte)local_1c & 0x7f) + 1) >> 1)) {
      iVar2 = wstatus_to_exit_status((pid_t)exit_status_local,local_1c);
      *_w = iVar2;
      exit_status_local._7_1_ = true;
    }
    else {
      if (_Var1 != 0) {
        __assert_fail("w == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/proc.c"
                      ,0x7d,"_Bool proc_terminated(pid_t, int *)");
      }
      exit_status_local._7_1_ = false;
    }
  }
  else {
    exit_status_local._7_1_ = false;
  }
  return exit_status_local._7_1_;
}

Assistant:

bool proc_terminated(pid_t pid, int *exit_status) {
    int wstatus = 0;
    int w = waitpid(pid, &wstatus, WNOHANG);
    if (w < 0) {
        perror("waitpid");
        exit(EXIT_FAILURE);
    }

    if (w != pid) {
        return false;
    }

    if (WIFEXITED(wstatus) || WIFSIGNALED(wstatus)) {
        *exit_status = wstatus_to_exit_status(pid, wstatus);
        return true;
    } else {
        assert(w == 0);
    }

    return false;
}